

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O2

ON_SubDSectorType *
ON_SubDSectorType::CreateDartSectorType
          (ON_SubDSectorType *__return_storage_ptr__,uint sector_face_count)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  bVar2 = ON_SubDSectorType_IsValidFaceCountForCreate(Dart,sector_face_count);
  if (bVar2) {
    __return_storage_ptr__->m_vertex_tag = Unset;
    __return_storage_ptr__->m_reserved1 = '\0';
    __return_storage_ptr__->m_reserved2 = 0;
    __return_storage_ptr__->m_hash = 0;
    __return_storage_ptr__->m_corner_sector_angle_index = 0;
    __return_storage_ptr__->m_sector_face_count = 0;
    __return_storage_ptr__->m_sector_coefficient = 0.0;
    __return_storage_ptr__->m_sector_theta = 0.0;
    __return_storage_ptr__->m_corner_sector_angle_radians = 0.0;
    __return_storage_ptr__->m_vertex_tag = Dart;
    bVar2 = ON_SubDSectorType_IsValidFaceCount(Dart,sector_face_count);
    uVar3 = 0;
    if (bVar2) {
      uVar3 = sector_face_count;
    }
    __return_storage_ptr__->m_sector_face_count = uVar3;
    if (uVar3 == 0) {
      __return_storage_ptr__->m_sector_coefficient = -8883.0;
      uVar4 = 0;
      uVar5 = 0xc0c15900;
    }
    else {
      dVar1 = DartSectorCoefficient(sector_face_count);
      __return_storage_ptr__->m_sector_coefficient = dVar1;
      dVar1 = DartSectorTheta(sector_face_count);
      uVar4 = SUB84(dVar1,0);
      uVar5 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    __return_storage_ptr__->m_sector_theta = (double)CONCAT44(uVar5,uVar4);
    SetHash(__return_storage_ptr__);
  }
  else {
    ON_SubDIncrementErrorCount();
    __return_storage_ptr__->m_corner_sector_angle_radians = 0.0;
    __return_storage_ptr__->m_sector_coefficient = 0.0;
    __return_storage_ptr__->m_sector_theta = 0.0;
    __return_storage_ptr__->m_vertex_tag = Unset;
    __return_storage_ptr__->m_reserved1 = '\0';
    __return_storage_ptr__->m_reserved2 = 0;
    __return_storage_ptr__->m_hash = 0;
    __return_storage_ptr__->m_corner_sector_angle_index = 0;
    __return_storage_ptr__->m_sector_face_count = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubDSectorType ON_SubDSectorType::CreateDartSectorType(
  unsigned int sector_face_count
  )
{
  const ON_SubDVertexTag vertex_tag = ON_SubDVertexTag::Dart;
  if ( ON_SubDSectorType_IsValidFaceCountForCreate(vertex_tag,sector_face_count) )
  {
    ON_SubDSectorType st;
    st.m_vertex_tag = vertex_tag;
    st.m_sector_face_count 
      = ON_SubDSectorType_IsValidFaceCount(vertex_tag,sector_face_count)
      ? sector_face_count
      : 0;
    st.m_sector_coefficient
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorCoefficient(sector_face_count)
      : ON_SubDSectorType::UnsetSectorCoefficient;
    st.m_sector_theta 
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorTheta(sector_face_count)
      : ON_SubDSectorType::UnsetSectorTheta;
    st.SetHash();
    return st;
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::Empty);
}